

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoEngine.cpp
# Opt level: O3

void __thiscall VideoEngine::Canvas::Canvas(Canvas *this,int w,int h)

{
  Texture *this_00;
  GLuint *pGVar1;
  GLuint depth_renderbuffer;
  Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  undefined4 local_9c;
  string local_98;
  string local_78;
  anon_union_32_2_9b3c4038_for_Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  local_58;
  byte local_38;
  
  this_00 = &this->color_;
  this->program_ = (Handle)0x0;
  (this->color_).name_ = 0;
  (this->color_).w_ = 0;
  (this->color_).h_ = 0;
  glGenTextures(1,this_00);
  pGVar1 = &(this->fb_).name;
  (this->fb_).w = 0;
  (this->fb_).h = 0;
  (this->fb_).num_targets = 0;
  (this->fb_).name = 0;
  glGenFramebuffers(1,pGVar1);
  Texture::upload(this_00,w,h,0x1908,0x1908,0x1401,(void *)0x0);
  glBindFramebuffer(0x8d40,*pGVar1);
  GLCHECK("glBindFramebuffer(GL_FRAMEBUFFER, fb_.name)");
  glGenRenderbuffers(1,&local_9c);
  GLCHECK("glGenRenderbuffers(1, &depth_renderbuffer)");
  glBindRenderbuffer(0x8d41,local_9c);
  GLCHECK("glBindRenderbuffer(GL_RENDERBUFFER, depth_renderbuffer)");
  glRenderbufferStorage(0x8d41,0x1902,w,h);
  GLCHECK("glRenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT, w, h)");
  glBindRenderbuffer(0x8d41,0);
  GLCHECK("glBindRenderbuffer(GL_RENDERBUFFER, 0)");
  glFramebufferRenderbuffer(0x8d40,0x8d00,0x8d41,local_9c);
  GLCHECK(
         "glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depth_renderbuffer)"
         );
  Framebuffer::attachColorTexture(&this->fb_,0,this_00);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "#version 130\nuniform sampler2D frame;\nuniform vec2 R;\nvoid main() {\nvec2 ts = vec2(textureSize(frame, 0));\nvec2 k = ts / R;\nfloat scale = max(k.x, k.y);\nvec2 off = (R-ts/scale)/2. * vec2(step(k.x, k.y), step(k.y, k.x));\nvec2 tc = scale * (gl_FragCoord.xy - off);\ngl_FragColor = vec4(0.);\nif (tc.x >= 0. && tc.x < ts.x && tc.y >= 0. && tc.y < ts.y)\ngl_FragColor = texture2D(frame, tc / (ts + vec2(1.)));\n}\n"
             ,"");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"void main() { gl_Position = gl_Vertex; }","");
  Program::create((Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58.value_,&local_78,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_38 == 0) {
    aAppDebugPrintf("[CRASH] Cannot create canvas program: %s",
                    local_58.error_.error_._M_dataplus._M_p);
    aAppTerminate(-1);
  }
  if ((local_38 & 1) == 0) {
    aAppDebugPrintf("[CRASH] Unexpected");
    aAppTerminate(-1);
  }
  Program::Handle::operator=((Handle *)this,&local_58.value_.handle_);
  Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected((Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_58.value_);
  return;
}

Assistant:

Canvas(int w, int h) {
		color_.alloc(w, h, RGBA8);
		GL(glBindFramebuffer(GL_FRAMEBUFFER, fb_.name));

		GLuint depth_renderbuffer;
		GL(glGenRenderbuffers(1, &depth_renderbuffer));
		GL(glBindRenderbuffer(GL_RENDERBUFFER, depth_renderbuffer));
		GL(glRenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT, w, h));
		GL(glBindRenderbuffer(GL_RENDERBUFFER, 0));
		GL(glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depth_renderbuffer));
		//GL(glDeleteRenderbuffers(1, &depth_renderbuffer));

		fb_.attachColorTexture(0, color_);

		auto p = Program::create(
			"#version 130\n"
			"uniform sampler2D frame;\n"
			"uniform vec2 R;\n"
			"void main() {\n"
				"vec2 ts = vec2(textureSize(frame, 0));\n"
				"vec2 k = ts / R;\n"
				"float scale = max(k.x, k.y);\n"
				"vec2 off = (R-ts/scale)/2. * vec2(step(k.x, k.y), step(k.y, k.x));\n"
				"vec2 tc = scale * (gl_FragCoord.xy - off);\n"
				"gl_FragColor = vec4(0.);\n"
				"if (tc.x >= 0. && tc.x < ts.x && tc.y >= 0. && tc.y < ts.y)\n"
					"gl_FragColor = texture2D(frame, tc / (ts + vec2(1.)));\n"
			"}\n",
			"void main() { gl_Position = gl_Vertex; }");

		if (!p)
			CRASH("Cannot create canvas program: %s", p.error().c_str());

		program_ = std::move(p).value();
	}